

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test::iterate
          (MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test *this)

{
  ostringstream *this_00;
  undefined4 uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_01;
  long lVar5;
  GLint gl_max_internalformat_samples_value;
  GLint gl_max_samples_value;
  int local_1c4;
  MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test *local_1c0;
  undefined4 local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_1c0 = this;
  initInternals(this);
  local_1b4 = 0;
  (**(code **)(lVar4 + 0x868))(0x8d57);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not retrieve GL_MAX_SAMPLES value.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x74a);
  lVar5 = 0;
  do {
    uVar1 = *(undefined4 *)((long)&DAT_01b16210 + lVar5);
    local_1c4 = -1;
    (**(code **)(lVar4 + 0x880))(0x8d41,uVar1,0x80a9,1,&local_1c4);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGetInternalformativ() failed to retrieve GL_SAMPLES",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                    ,0x75b);
    (**(code **)(lVar4 + 0x1240))(0x8d41,local_1c4 + 1,uVar1,1,1);
    iVar2 = (**(code **)(lVar4 + 0x800))();
    if (iVar2 != 0x502) {
      local_1b0._0_8_ = ((local_1c0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"glRenderbufferStorageMultisample() generated error code ",0x38)
      ;
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," when GL_INVALID_OPERATION was expected.",0x28);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Invalid error code generated by glRenderbufferStorageMultisample() call.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                 ,0x768);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x18);
  tcu::TestContext::setTestResult
            ((local_1c0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS
             ,"Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Retrieve GL_MAX_SAMPLES pname value */
	glw::GLint gl_max_samples_value = 0;

	gl.getIntegerv(GL_MAX_SAMPLES, &gl_max_samples_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve GL_MAX_SAMPLES value.");

	/* Iterate through a set of valid non-integer internalformats */
	const glw::GLenum noninteger_internalformats[] = {
		GL_RGB8, GL_RGB565, GL_SRGB8_ALPHA8, GL_DEPTH_COMPONENT32F, GL_DEPTH24_STENCIL8, GL_STENCIL_INDEX8
	};
	const unsigned int n_noninteger_internalformats =
		sizeof(noninteger_internalformats) / sizeof(noninteger_internalformats[0]);

	for (unsigned int n_internalformat = 0; n_internalformat < n_noninteger_internalformats; ++n_internalformat)
	{
		glw::GLenum		  error_code						  = GL_NO_ERROR;
		const glw::GLenum internalformat					  = noninteger_internalformats[n_internalformat];
		glw::GLint		  gl_max_internalformat_samples_value = -1;

		/* Retrieve maximum amount of samples available for the texture target considered */
		gl.getInternalformativ(GL_RENDERBUFFER, internalformat, GL_SAMPLES, 1, &gl_max_internalformat_samples_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed to retrieve GL_SAMPLES");

		/* Execute the test */
		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, gl_max_internalformat_samples_value + 1, internalformat,
										  1,  /* width */
										  1); /* height */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glRenderbufferStorageMultisample() generated error code "
							   << error_code << " when GL_INVALID_OPERATION was expected." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid error code generated by glRenderbufferStorageMultisample() call.");
		}
	} /* for (all internalformats) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}